

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

String * __thiscall
Json::Value::Comments::get_abi_cxx11_
          (String *__return_storage_ptr__,Comments *this,CommentPlacement slot)

{
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var1;
  long lVar2;
  
  _Var1._M_head_impl =
       (this->ptr_)._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl ==
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *(long *)((long)(_Var1._M_head_impl)->_M_elems + (ulong)slot * 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,
               *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + (ulong)slot * 0x20 + 8) + lVar2
              );
  }
  return __return_storage_ptr__;
}

Assistant:

String Value::Comments::get(CommentPlacement slot) const {
  if (!ptr_)
    return {};
  return (*ptr_)[slot];
}